

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_curve_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  uint uVar1;
  REF_STATUS RVar2;
  char *pcVar3;
  REF_INT local_154;
  REF_INT local_150;
  REF_INT local_14c;
  REF_INT local_148;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL s [3];
  REF_DBL ks;
  REF_DBL r [3];
  REF_DBL local_e8;
  REF_DBL kr;
  uint local_d8;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT node;
  REF_INT local;
  REF_INT item;
  REF_INT nodes [27];
  int local_50;
  int local_4c;
  REF_INT cell;
  REF_INT geom;
  REF_DICT ref_dict;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID pRStack_18;
  REF_INT id_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_geom = (REF_GEOM)ref_grid->cell[3];
  ref_dict = (REF_DICT)ref_grid->geom;
  local_e8 = 0.0;
  ks = 0.0;
  r[0] = 0.0;
  r[1] = 0.0;
  s[2] = 0.0;
  _ref_private_macro_code_rss_1 = (char *)0x0;
  s[0] = 0.0;
  s[1] = 0.0;
  ref_node = (REF_NODE)file;
  file_local._4_4_ = id;
  pRStack_18 = ref_grid;
  uVar1 = ref_dict_create((REF_DICT *)&cell);
  if (uVar1 == 0) {
    for (local_4c = 0; local_4c < ref_dict->max; local_4c = local_4c + 1) {
      if (((ref_dict->key[local_4c * 6] == 2) &&
          (file_local._4_4_ == ref_dict->key[local_4c * 6 + 1])) &&
         (uVar1 = ref_dict_store(_cell,ref_dict->key[local_4c * 6 + 5],local_4c), uVar1 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xdb9,"ref_geom_curve_tec_zone",(ulong)uVar1,"mark nodes");
        return uVar1;
      }
    }
    local_d8 = _cell->n;
    kr._4_4_ = 0;
    for (local_50 = 0; local_50 < *(int *)((long)&ref_geom->initial_cell_height + 4);
        local_50 = local_50 + 1) {
      RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_50,&local);
      if ((RVar2 == 0) && (file_local._4_4_ == nodes[1])) {
        kr._4_4_ = kr._4_4_ + 1;
      }
    }
    if ((local_d8 == 0) || (kr._4_4_ == 0)) {
      ref_grid_local._4_4_ = ref_dict_free(_cell);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xdc7,"ref_geom_curve_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
      }
    }
    else {
      pcVar3 = "fetriangle";
      fprintf((FILE *)ref_node,
              "zone t=\"curve%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)file_local._4_4_,(ulong)local_d8,(ulong)kr._4_4_,"point","fetriangle");
      node = 0;
      if (_cell->n < 1) {
        local_148 = -1;
      }
      else {
        local_148 = *_cell->key;
      }
      ntri = local_148;
      if (_cell->n < 1) {
        local_14c = -1;
      }
      else {
        local_14c = *_cell->value;
      }
      local_4c = local_14c;
      while (node < _cell->n) {
        if ((ref_dict[4].key != (REF_INT *)0x0) &&
           (uVar1 = ref_egads_face_curvature
                              ((REF_GEOM)ref_dict,local_4c,&local_e8,&ks,s + 2,
                               (REF_DBL *)&ref_private_macro_code_rss_1), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xdd2,"ref_geom_curve_tec_zone",(ulong)uVar1,"curve",pcVar3);
          return uVar1;
        }
        if ((ref_dict[6].value != (REF_INT *)0x0) &&
           (uVar1 = ref_meshlink_face_curvature
                              (pRStack_18,local_4c,&local_e8,&ks,s + 2,
                               (REF_DBL *)&ref_private_macro_code_rss_1), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xdd5,"ref_geom_curve_tec_zone",(ulong)uVar1,"curve",pcVar3);
          return uVar1;
        }
        pcVar3 = _ref_private_macro_code_rss_1;
        fprintf((FILE *)ref_node,
                " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                *(undefined8 *)(ref_cell->c2n + (long)(ntri * 0xf) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(ntri * 0xf + 1) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(ntri * 0xf + 2) * 2),local_e8,ks,r[0],r[1],
                s[2]);
        node = node + 1;
        if ((node < 0) || (_cell->n <= node)) {
          local_150 = -1;
        }
        else {
          local_150 = _cell->key[node];
        }
        ntri = local_150;
        if ((node < 0) || (_cell->n <= node)) {
          local_154 = -1;
        }
        else {
          local_154 = _cell->value[node];
        }
        local_4c = local_154;
      }
      for (local_50 = 0; local_50 < *(int *)((long)&ref_geom->initial_cell_height + 4);
          local_50 = local_50 + 1) {
        RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_50,&local);
        if ((RVar2 == 0) && (file_local._4_4_ == nodes[1])) {
          for (ntri = 0; ntri < 3; ntri = ntri + 1) {
            uVar1 = ref_dict_location(_cell,(&local)[ntri],&nnode);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xde2,"ref_geom_curve_tec_zone",(ulong)uVar1,"localize");
              return uVar1;
            }
            fprintf((FILE *)ref_node," %d",(ulong)(nnode + 1));
          }
          fprintf((FILE *)ref_node,"\n");
        }
      }
      ref_grid_local._4_4_ = ref_dict_free(_cell);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xde9,"ref_geom_curve_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xdb4,
           "ref_geom_curve_tec_zone",(ulong)uVar1,"create dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_curve_tec_zone(REF_GRID ref_grid, REF_INT id,
                                                  FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, ntri;
  REF_DBL kr, r[3], ks, s[3];
  kr = 0;
  r[0] = 0;
  r[1] = 0;
  r[2] = 0;
  ks = 0;
  s[0] = 0;
  s[1] = 0;
  s[2] = 0;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
    }
  }
  nnode = ref_dict_n(ref_dict);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(file,
          "zone t=\"curve%d\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          id, nnode, ntri, "point", "fetriangle");

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), "curve");
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s), "curve");
    }
    fprintf(file,
            " %.16e %.16e %.16e %.16e %.16e %.16e %.16e "
            "%.16e %.16e %.16e %.16e\n",
            ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
            ref_node_xyz(ref_node, 2, node), kr, r[0], r[1], r[2], ks, s[0],
            s[1], s[2]);
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      for (node = 0; node < 3; node++) {
        RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}